

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O3

AdaptiveSnifferResult * __thiscall
duckdb::CSVSniffer::MinimalSniff(AdaptiveSnifferResult *__return_storage_ptr__,CSVSniffer *this)

{
  OpenFileInfo *pOVar1;
  unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
  *set_columns;
  vector<duckdb::LogicalType,_true> *this_00;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *__x;
  idx_t iVar2;
  CSVReaderOptions *pCVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  unsigned_long *puVar5;
  CSVSniffer *this_01;
  CSVReaderOptions *options;
  CSVIterator iterator;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  undefined8 uVar8;
  int iVar9;
  CSVBufferManager *pCVar10;
  reference pvVar11;
  CSVStateMachine *pCVar12;
  pointer pSVar13;
  CSVErrorHandler *this_02;
  undefined4 extraout_var;
  DataChunk *data_chunk;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *pvVar14;
  type pCVar15;
  reference vector;
  MultiFileOptions *file_options;
  mapped_type *pmVar16;
  reference other;
  long lVar17;
  vector<duckdb::ColumnCount,_true> *this_03;
  element_type *peVar18;
  CSVIterator *pCVar19;
  idx_t *piVar20;
  size_type __n;
  byte bVar21;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  scanner;
  shared_ptr<duckdb::CSVStateMachine,_true> state_machine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  vector<duckdb::HeaderValue,_true> potential_header;
  vector<duckdb::LogicalType,_true> return_types;
  ColumnCountScanner count_scanner;
  idx_t in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  CSVErrorHandler *in_stack_fffffffffffffbd0;
  undefined1 auVar22 [32];
  undefined1 in_stack_fffffffffffffbd8 [40];
  undefined1 local_3f0 [32];
  ColumnCountResult *local_3d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  undefined1 local_3c0 [8];
  _Alloc_hider local_3b8;
  pointer local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_398;
  shared_ptr<duckdb::CSVBufferManager,_true> local_388;
  undefined1 local_378 [40];
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_350;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_348;
  undefined1 local_340 [8];
  _Alloc_hider local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_330;
  _Alloc_hider local_318;
  idx_t iStack_310;
  undefined1 local_308 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_300;
  vector<duckdb::LogicalType,_true> local_2e8;
  undefined1 local_2d0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2b8;
  vector<duckdb::LogicalType,_true> local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_288;
  vector<duckdb::LogicalType,_true> local_268;
  CSVIterator local_248;
  ColumnCountScanner local_200;
  
  bVar21 = 0;
  __x = &((this->set_columns).types)->
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  if ((__x != (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x0) &&
     ((__x->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (__x->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2a0,__x);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2b8,
             &((this->set_columns).names)->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    AdaptiveSnifferResult::AdaptiveSnifferResult(__return_storage_ptr__,&local_2a0,&local_2b8,true);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2b8);
    pvVar14 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2a0;
    goto LAB_01501a33;
  }
  local_318._M_p = (pointer)0x0;
  iStack_310 = 0;
  local_308 = (undefined1  [8])0x0;
  pCVar10 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&this->buffer_manager);
  pCVar10->sniffing = true;
  local_200.super_BaseScanner._vptr_BaseScanner = (_func_int **)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVStateMachine,std::allocator<duckdb::CSVStateMachine>,duckdb::CSVReaderOptions&,duckdb::CSVStateMachineOptions&,duckdb::CSVStateMachineCache&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_200.super_BaseScanner.csv_file_scan,(CSVStateMachine **)&local_200,
             (allocator<duckdb::CSVStateMachine> *)local_3c0,this->options,
             (CSVStateMachineOptions *)this->options,this->state_machine_cache);
  local_3f0._8_8_ = local_200.super_BaseScanner._vptr_BaseScanner;
  local_3f0._16_8_ =
       local_200.super_BaseScanner.csv_file_scan.internal.
       super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_200.super_BaseScanner.csv_file_scan.internal.
      super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pOVar1 = &((local_200.super_BaseScanner.csv_file_scan.internal.
                  super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_BaseFileReader).file;
      *(int *)&(pOVar1->path)._M_dataplus._M_p = *(int *)&(pOVar1->path)._M_dataplus._M_p + 1;
      UNLOCK();
      if (local_200.super_BaseScanner.csv_file_scan.internal.
          super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) goto LAB_01501408;
    }
    else {
      pOVar1 = &((local_200.super_BaseScanner.csv_file_scan.internal.
                  super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_BaseFileReader).file;
      *(int *)&(pOVar1->path)._M_dataplus._M_p = *(int *)&(pOVar1->path)._M_dataplus._M_p + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_200.super_BaseScanner.csv_file_scan.internal.
               super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
LAB_01501408:
  local_388.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (this->buffer_manager).internal.
         super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_388.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->buffer_manager).internal.
       super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_388.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_388.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_388.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_388.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_388.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_398.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (this->error_handler).internal.
         super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_398.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->error_handler).internal.
       super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_398.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_398.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_398.internal.
            super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_398.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_398.internal.
            super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  CSVIterator::CSVIterator(&local_248);
  pCVar19 = &local_248;
  piVar20 = (idx_t *)&stack0xfffffffffffffbb8;
  for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
    *piVar20 = (pCVar19->pos).buffer_idx;
    pCVar19 = (CSVIterator *)((long)pCVar19 + ((ulong)bVar21 * -2 + 1) * 8);
    piVar20 = piVar20 + (ulong)bVar21 * -2 + 1;
  }
  iterator.pos.buffer_pos = in_stack_fffffffffffffbc0;
  iterator.pos.buffer_idx = in_stack_fffffffffffffbb8;
  iterator.done = (bool)(char)in_stack_fffffffffffffbc8;
  iterator.first_one = (bool)(char)((ulong)in_stack_fffffffffffffbc8 >> 8);
  iterator._18_6_ = (int6)((ulong)in_stack_fffffffffffffbc8 >> 0x10);
  iterator.buffer_size = (idx_t)in_stack_fffffffffffffbd0;
  auVar22 = in_stack_fffffffffffffbd8._0_32_;
  iterator.boundary.buffer_idx = auVar22._0_8_;
  iterator.boundary.buffer_pos = auVar22._8_8_;
  iterator.boundary.boundary_idx = auVar22._16_8_;
  iterator.boundary.end_pos = auVar22._24_8_;
  iterator.is_set = (bool)in_stack_fffffffffffffbd8[0x20];
  iterator._65_7_ = in_stack_fffffffffffffbd8._33_7_;
  ColumnCountScanner::ColumnCountScanner
            (&local_200,&local_388,(shared_ptr<duckdb::CSVStateMachine,_true> *)(local_3f0 + 8),
             &local_398,0x800,iterator);
  local_3f0._24_8_ = this;
  if (local_398.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.internal.
               super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_388.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_3d0 = ColumnCountScanner::ParseChunk(&local_200);
  if (local_3d0->result_position == 0) {
    local_268.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AdaptiveSnifferResult::AdaptiveSnifferResult(__return_storage_ptr__,&local_268,&local_288,false)
    ;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_288);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_268);
  }
  else {
    this_03 = &local_3d0->column_counts;
    pvVar11 = vector<duckdb::ColumnCount,_true>::operator[](this_03,0);
    iVar2 = pvVar11->number_of_columns;
    pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                        ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_3f0 + 8));
    (pCVar12->dialect_options).num_cols = iVar2;
    pvVar11 = vector<duckdb::ColumnCount,_true>::operator[](this_03,0);
    uVar6 = local_3f0._24_8_;
    ((*(CSVReaderOptions **)(local_3f0._24_8_ + 200))->dialect_options).num_cols =
         pvVar11->number_of_columns;
    ColumnCountScanner::UpgradeToStringValueScanner((ColumnCountScanner *)local_3f0);
    pSVar13 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
              ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                            *)local_3f0);
    this_02 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                        (&(pSVar13->super_BaseScanner).error_handler);
    CSVErrorHandler::SetIgnoreErrors(this_02,true);
    local_350._M_head_impl = (RegisteredStateManager *)&this->buffer_manager;
    pSVar13 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
              ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                            *)local_3f0);
    iVar9 = (*(pSVar13->super_BaseScanner)._vptr_BaseScanner[2])(pSVar13);
    data_chunk = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar9));
    local_378._24_8_ = uVar6 + 0xe8;
    local_378._32_8_ = uVar6 + 0xf8;
    local_348._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(local_3d0->result_position == 2);
    set_columns = (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                   *)(uVar6 + 0x150);
    peVar18 = (element_type *)0x0;
    while( true ) {
      local_3c0 = (undefined1  [8])peVar18;
      pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                          ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_3f0 + 8));
      if ((element_type *)(pCVar12->dialect_options).num_cols <= peVar18) break;
      pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                          ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_3f0 + 8));
      pCVar3 = pCVar12->options;
      pvVar14 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                ::std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)set_columns,(key_type *)local_3c0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (pvVar14,&(pCVar3->auto_type_candidates).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      peVar18 = (element_type *)((long)(StateMachine **)local_3c0 + 1);
    }
    pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*
                        ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_3f0 + 8));
    SniffTypes((CSVSniffer *)uVar6,data_chunk,pCVar15,set_columns,(idx_t)local_348._M_pi);
    local_378._0_8_ = (element_type *)0x0;
    local_378._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_378._16_8_ = (element_type *)0x0;
    if ((data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        vector = vector<duckdb::Vector,_true>::operator[](&data_chunk->data,__n);
        paVar4 = (anon_union_16_2_67f50693_for_value *)vector->data;
        FlatVector::VerifyFlatVector(vector);
        local_3c0[0] = 1;
        local_3b0 = (pointer)0x0;
        local_3a8._M_local_buf[0] = '\0';
        puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_3b8._M_p = (pointer)&local_3a8;
        if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
          HeaderValue::HeaderValue((HeaderValue *)local_340,(string_t)paVar4->pointer);
          local_3c0[0] = local_340[0];
          ::std::__cxx11::string::operator=((string *)&local_3b8,(string *)&local_338);
          if (local_338._M_p != aStack_330._M_local_buf + 8) {
            operator_delete(local_338._M_p);
          }
        }
        ::std::vector<duckdb::HeaderValue,std::allocator<duckdb::HeaderValue>>::
        emplace_back<duckdb::HeaderValue&>
                  ((vector<duckdb::HeaderValue,std::allocator<duckdb::HeaderValue>> *)local_378,
                   (HeaderValue *)local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != &local_3a8) {
          operator_delete(local_3b8._M_p);
        }
        __n = __n + 1;
      } while (__n < (ulong)(((long)(data_chunk->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(data_chunk->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
    }
    pCVar10 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                        ((shared_ptr<duckdb::CSVBufferManager,_true> *)local_350._M_head_impl);
    this_01 = (CSVSniffer *)pCVar10->context;
    pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*
                        ((shared_ptr<duckdb::CSVStateMachine,_true> *)(local_3f0 + 8));
    pCVar3 = *(CSVReaderOptions **)(local_3f0._24_8_ + 200);
    options = *(CSVReaderOptions **)(local_3f0._24_8_ + 0xd0);
    file_options = (MultiFileOptions *)
                   shared_ptr<duckdb::CSVErrorHandler,_true>::operator*
                             ((shared_ptr<duckdb::CSVErrorHandler,_true> *)local_378._32_8_);
    DetectHeaderInternal_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_3c0,this_01,(ClientContext *)local_378,
               (vector<duckdb::HeaderValue,_true> *)pCVar15,(CSVStateMachine *)local_378._24_8_,
               (SetColumns *)set_columns,
               (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                *)pCVar3,options,file_options,in_stack_fffffffffffffbd0);
    uVar6 = local_3f0._24_8_;
    local_3c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
           *)(local_3f0._24_8_ + 0x150))->_M_h)._M_element_count != 0) {
      this_00 = (vector<duckdb::LogicalType,_true> *)(local_3f0._24_8_ + 0x238);
      do {
        pmVar16 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)set_columns,(key_type *)&local_3c8);
        other = vector<duckdb::LogicalType,_true>::back(pmVar16);
        LogicalType::LogicalType((LogicalType *)local_340,other);
        pmVar16 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)set_columns,(key_type *)&local_3c8);
        if ((long)(pmVar16->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pmVar16->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
            (long)((*(CSVReaderOptions **)(uVar6 + 200))->auto_type_candidates).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)((*(CSVReaderOptions **)(uVar6 + 200))->auto_type_candidates).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          LogicalType::LogicalType((LogicalType *)local_2d0,VARCHAR);
          uVar8 = aStack_330._M_allocated_capacity;
          _Var7._M_p = local_338._M_p;
          local_340._0_2_ = local_2d0._0_2_;
          local_338._M_p = (pointer)local_2d0._8_8_;
          aStack_330._M_allocated_capacity = local_2d0._16_8_;
          local_2d0._8_8_ = _Var7._M_p;
          local_2d0._16_8_ = uVar8;
          LogicalType::~LogicalType((LogicalType *)local_2d0);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,
                   (LogicalType *)local_340);
        LogicalType::~LogicalType((LogicalType *)local_340);
        local_3c8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(local_3c8._M_pi)->_vptr__Sp_counted_base + 1);
      } while (local_3c8._M_pi <
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                  *)(uVar6 + 0x150))->_M_h)._M_element_count);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2e8,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(uVar6 + 0x238))
    ;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_300,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3c0);
    AdaptiveSnifferResult::AdaptiveSnifferResult
              (__return_storage_ptr__,&local_2e8,&local_300,1 < local_3d0->result_position);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_300);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2e8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3c0);
    ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::~vector
              ((vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_> *)local_378);
    if ((tuple<duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>)
        local_3f0._0_8_ != (_Head_base<0UL,_duckdb::StringValueScanner_*,_false>)0x0) {
      (**(code **)(*(_func_int **)local_3f0._0_8_ + 8))();
    }
  }
  local_200.super_BaseScanner._vptr_BaseScanner = (_func_int **)&PTR__ColumnCountScanner_02457628;
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
  ::~_Rb_tree(&local_200.result.buffer_handles._M_t);
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&local_200.result.rows_per_column_count._M_t);
  if (local_200.result.column_counts.
      super_vector<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>.
      super__Vector_base<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.result.column_counts.
                    super_vector<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>.
                    super__Vector_base<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  BaseScanner::~BaseScanner(&local_200.super_BaseScanner);
  if ((element_type *)local_3f0._16_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._16_8_);
  }
  pvVar14 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_318;
LAB_01501a33:
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(pvVar14);
  return __return_storage_ptr__;
}

Assistant:

AdaptiveSnifferResult CSVSniffer::MinimalSniff() {
	if (set_columns.IsSet()) {
		// Nothing to see here
		return AdaptiveSnifferResult(*set_columns.types, *set_columns.names, true);
	}
	// Return Types detected
	vector<LogicalType> return_types;
	// Column Names detected
	buffer_manager->sniffing = true;
	constexpr idx_t result_size = STANDARD_VECTOR_SIZE;

	auto state_machine =
	    make_shared_ptr<CSVStateMachine>(options, options.dialect_options.state_machine_options, state_machine_cache);
	ColumnCountScanner count_scanner(buffer_manager, state_machine, error_handler, result_size);
	auto &sniffed_column_counts = count_scanner.ParseChunk();
	if (sniffed_column_counts.result_position == 0) {
		// The file is an empty file, we just return
		return {{}, {}, false};
	}

	state_machine->dialect_options.num_cols = sniffed_column_counts[0].number_of_columns;
	options.dialect_options.num_cols = sniffed_column_counts[0].number_of_columns;

	// First figure out the number of columns on this configuration
	auto scanner = count_scanner.UpgradeToStringValueScanner();
	scanner->error_handler->SetIgnoreErrors(true);
	// Parse chunk and read csv with info candidate
	auto &data_chunk = scanner->ParseChunk().ToChunk();
	idx_t start_row = 0;
	if (sniffed_column_counts.result_position == 2) {
		// If equal to two, we will only use the second row for type checking
		start_row = 1;
	}

	// Gather Types
	for (idx_t i = 0; i < state_machine->dialect_options.num_cols; i++) {
		best_sql_types_candidates_per_column_idx[i] = state_machine->options.auto_type_candidates;
	}
	SniffTypes(data_chunk, *state_machine, best_sql_types_candidates_per_column_idx, start_row);

	// Possibly Gather Header
	vector<HeaderValue> potential_header;
	for (idx_t col_idx = 0; col_idx < data_chunk.ColumnCount(); col_idx++) {
		auto &cur_vector = data_chunk.data[col_idx];
		const auto vector_data = FlatVector::GetData<string_t>(cur_vector);
		auto &validity = FlatVector::Validity(cur_vector);
		HeaderValue val;
		if (validity.RowIsValid(0)) {
			val = HeaderValue(vector_data[0]);
		}
		potential_header.emplace_back(val);
	}

	auto names = DetectHeaderInternal(buffer_manager->context, potential_header, *state_machine, set_columns,
	                                  best_sql_types_candidates_per_column_idx, options, file_options, *error_handler);

	for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
		LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
		if (best_sql_types_candidates_per_column_idx[column_idx].size() == options.auto_type_candidates.size()) {
			d_type = LogicalType::VARCHAR;
		}
		detected_types.push_back(d_type);
	}
	return {detected_types, names, sniffed_column_counts.result_position > 1};
}